

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  uint uVar1;
  FT_Memory memory;
  PS_Blend pPVar2;
  PS_FontInfo pPVar3;
  PS_Private pPVar4;
  FT_BBox *pFVar5;
  ulong uVar6;
  FT_Fixed *pFVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  FT_Error error;
  FT_Error local_3c;
  ulong local_38;
  
  memory = (face->root).memory;
  local_3c = 0;
  pPVar2 = face->blend;
  if (pPVar2 == (PS_Blend)0x0) {
    pPVar2 = (PS_Blend)ft_mem_alloc(memory,0x300,&local_3c);
    if (local_3c != 0) {
      return local_3c;
    }
    pPVar2->num_default_design_vector = 0;
    face->blend = pPVar2;
  }
  if (num_designs == 0) {
LAB_001793d3:
    uVar10 = pPVar2->num_axis;
    if (num_axis != 0) {
      if (uVar10 != 0 && uVar10 != num_axis) goto LAB_0017942b;
      pPVar2->num_axis = num_axis;
      uVar10 = num_axis;
    }
    uVar1 = pPVar2->num_designs;
    if ((uVar10 != 0 && (ulong)uVar1 != 0) && (pPVar2->design_pos[0] == (FT_Fixed *)0x0)) {
      pFVar7 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)(uVar10 * uVar1),(void *)0x0,&local_3c);
      pPVar2->design_pos[0] = pFVar7;
      if ((local_3c == 0) && (1 < uVar1)) {
        lVar8 = 0;
        uVar9 = uVar10;
        do {
          pPVar2->design_pos[lVar8 + 1] = pFVar7 + uVar9;
          lVar8 = lVar8 + 1;
          uVar9 = uVar9 + uVar10;
        } while ((ulong)uVar1 - 1 != lVar8);
      }
    }
  }
  else {
    if (pPVar2->num_designs == 0) {
      local_38 = (ulong)num_designs;
      pPVar3 = (PS_FontInfo)ft_mem_realloc(memory,0x38,0,local_38,(void *)0x0,&local_3c);
      pPVar2->font_infos[1] = pPVar3;
      if (local_3c != 0) {
        return local_3c;
      }
      pPVar4 = (PS_Private)ft_mem_realloc(memory,0xe0,0,local_38,(void *)0x0,&local_3c);
      pPVar2->privates[1] = pPVar4;
      if (local_3c != 0) {
        return local_3c;
      }
      pFVar5 = (FT_BBox *)ft_mem_realloc(memory,0x20,0,local_38,(void *)0x0,&local_3c);
      pPVar2->bboxes[1] = pFVar5;
      if (local_3c != 0) {
        return local_3c;
      }
      pFVar7 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)(num_designs * 2),(void *)0x0,&local_3c)
      ;
      pPVar2->weight_vector = pFVar7;
      if (local_3c != 0) {
        return local_3c;
      }
      pPVar2->default_weight_vector = pFVar7 + local_38;
      pPVar2->font_infos[0] = &(face->type1).font_info;
      pPVar2->privates[0] = &(face->type1).private_dict;
      pPVar2->bboxes[0] = &(face->type1).font_bbox;
      if (num_designs != 1) {
        uVar6 = 3;
        if (3 < num_designs + 1) {
          uVar6 = (ulong)(num_designs + 1);
        }
        pPVar3 = pPVar2->font_infos[1];
        pFVar5 = pPVar2->bboxes[1];
        pPVar4 = pPVar2->privates[1];
        lVar8 = 0;
        do {
          pFVar5 = pFVar5 + 1;
          pPVar4 = pPVar4 + 1;
          pPVar3 = pPVar3 + 1;
          pPVar2->font_infos[lVar8 + 2] = pPVar3;
          pPVar2->privates[lVar8 + 2] = pPVar4;
          pPVar2->bboxes[lVar8 + 2] = pFVar5;
          lVar8 = lVar8 + 1;
        } while (uVar6 - 2 != lVar8);
      }
      pPVar2->num_designs = num_designs;
      goto LAB_001793d3;
    }
    if (pPVar2->num_designs == num_designs) goto LAB_001793d3;
LAB_0017942b:
    local_3c = 3;
  }
  return local_3c;
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs     ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs     ) ||
             FT_NEW_ARRAY( blend->weight_vector, num_designs * 2 ) )
          goto Exit;

        blend->default_weight_vector = blend->weight_vector + num_designs;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

    /* allocate the blend design pos table if needed */
    num_designs = blend->num_designs;
    num_axis    = blend->num_axis;
    if ( num_designs && num_axis && blend->design_pos[0] == 0 )
    {
      FT_UInt  n;


      if ( FT_NEW_ARRAY( blend->design_pos[0], num_designs * num_axis ) )
        goto Exit;

      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = blend->design_pos[0] + num_axis * n;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }